

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O0

int4 PrintLanguage::getCodepoint(uint1 *buf,int4 charsize,bool bigend,int4 *skip)

{
  int4 iVar1;
  int4 val4;
  int4 val3_1;
  int4 val2_2;
  int4 val3;
  int4 val2_1;
  int4 val2;
  int4 val;
  int4 trail;
  int4 sk;
  int4 codepoint;
  int4 *skip_local;
  bool bigend_local;
  int4 charsize_local;
  uint1 *buf_local;
  
  if (charsize == 2) {
    trail = readUtf16(buf,bigend);
    val = 2;
    if ((trail < 0xd800) || (0xdbff < trail)) {
      if ((0xdbff < trail) && (trail < 0xe000)) {
        return -1;
      }
    }
    else {
      iVar1 = readUtf16(buf + 2,bigend);
      val = 4;
      if ((iVar1 < 0xdc00) || (0xdfff < iVar1)) {
        return -1;
      }
      trail = trail * 0x400 + iVar1 + -0x35fdc00;
    }
  }
  else if (charsize == 1) {
    trail = (int4)*buf;
    if ((*buf & 0x80) == 0) {
      val = 1;
    }
    else if ((trail & 0xe0U) == 0xc0) {
      val = 2;
      if ((buf[1] & 0xc0) != 0x80) {
        return -1;
      }
      trail = (trail & 0x1fU) << 6 | buf[1] & 0x3f;
    }
    else if ((trail & 0xf0U) == 0xe0) {
      val = 3;
      if (((buf[1] & 0xc0) != 0x80) || ((buf[2] & 0xc0) != 0x80)) {
        return -1;
      }
      trail = (trail & 0xfU) << 0xc | (buf[1] & 0x3f) << 6 | buf[2] & 0x3f;
    }
    else {
      if ((trail & 0xf8U) != 0xf0) {
        return -1;
      }
      val = 4;
      if ((((buf[1] & 0xc0) != 0x80) || ((buf[2] & 0xc0) != 0x80)) || ((buf[3] & 0xc0) != 0x80)) {
        return -1;
      }
      trail = (trail & 7U) << 0x12 | (buf[1] & 0x3f) << 0xc | (buf[2] & 0x3f) << 6 | buf[3] & 0x3f;
    }
  }
  else {
    if (charsize != 4) {
      return -1;
    }
    val = 4;
    if (bigend) {
      trail = (uint)*buf * 0x1000000 + (uint)buf[1] * 0x10000 + (uint)buf[2] * 0x100 + (uint)buf[3];
    }
    else {
      trail = (uint)buf[3] * 0x1000000 + (uint)buf[2] * 0x10000 + (uint)buf[1] * 0x100 + (uint)*buf;
    }
  }
  if ((trail < 0xd800) || (0xdfff < trail)) {
    *skip = val;
    buf_local._4_4_ = trail;
  }
  else {
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int4 PrintLanguage::getCodepoint(const uint1 *buf,int4 charsize,bool bigend,int4 &skip)

{
  int4 codepoint;
  int4 sk = 0;
  if (charsize==2) {		// UTF-16
    codepoint = readUtf16(buf,bigend);
    sk += 2;
    if ((codepoint>=0xD800)&&(codepoint<=0xDBFF)) { // high surrogate
      int4 trail=readUtf16(buf+2,bigend);
      sk += 2;
      if ((trail<0xDC00)||(trail>0xDFFF)) return -1; // Bad trail
      codepoint = (codepoint<<10) + trail + (0x10000 - (0xD800 << 10) - 0xDC00);
    }
    else if ((codepoint>=0xDC00)&&(codepoint<=0xDFFF)) return -1; // trail before high
  }
  else if (charsize==1) {	// UTF-8
    int4 val = buf[0];
    if ((val&0x80)==0) {
      codepoint = val;
      sk = 1;
    }
    else if ((val&0xe0)==0xc0) {
      int4 val2 = buf[1];
      sk = 2;
      if ((val2&0xc0)!=0x80) return -1; // Not a valid UTF8-encoding
      codepoint = ((val&0x1f)<<6) | (val2 & 0x3f);
    }
    else if ((val&0xf0)==0xe0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      sk = 3;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)) return -1; // invalid encoding
      codepoint = ((val&0xf)<<12) | ((val2&0x3f)<<6) | (val3 & 0x3f);
    }
    else if ((val&0xf8)==0xf0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      int4 val4 = buf[3];
      sk = 4;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)||((val4&0xc0)!=0x80)) return -1;	// invalid encoding
      codepoint = ((val&7)<<18) | ((val2&0x3f)<<12) | ((val3&0x3f)<<6) | (val4 & 0x3f);
    }
    else
      return -1;
  }
  else if (charsize == 4) {	// UTF-32
    sk = 4;
    if (bigend)
      codepoint = (buf[0]<<24) + (buf[1]<<16) + (buf[2]<<8) + buf[3];
    else
      codepoint = (buf[3]<<24) + (buf[2]<<16) + (buf[1]<<8) + buf[0];
  }
  else
    return -1;
  if (codepoint >= 0xd800 && codepoint <= 0xdfff)
    return -1;		// Reserved for surrogates, invalid codepoints
  skip = sk;
  return codepoint;
}